

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O1

void duckdb::alp::AlpCompression<double,_true>::FindBestFactorAndExponent
               (double *input_vector,idx_t n_values,State *state)

{
  pointer pAVar1;
  char cVar2;
  AlpEncodingIndices AVar3;
  uint64_t uVar4;
  AlpEncodingIndices AVar5;
  ulong uVar6;
  ushort uVar7;
  ulong uVar8;
  long lVar9;
  uint64_t uVar10;
  AlpCombination *combination;
  pointer pAVar11;
  double dVar12;
  undefined1 auVar13 [16];
  vector<double,_true> vector_sample;
  vector<double,_true> local_58;
  State *local_38;
  
  local_58.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (double *)0x0;
  local_58.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_38 = state;
  if (n_values != 0) {
    auVar13._8_4_ = (int)(n_values >> 0x20);
    auVar13._0_8_ = n_values;
    auVar13._12_4_ = 0x45300000;
    dVar12 = ceil(((auVar13._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)n_values) - 4503599627370496.0)) * 0.03125);
    uVar6 = 1;
    if (1 < (uint)(long)dVar12) {
      uVar6 = (long)dVar12 & 0xffffffff;
    }
    uVar8 = 0;
    do {
      if (local_58.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_58,
                   (iterator)
                   local_58.super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,input_vector);
      }
      else {
        *local_58.super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish = *input_vector;
        local_58.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar8 = uVar8 + uVar6;
      input_vector = input_vector + uVar6;
    } while (uVar8 < n_values);
  }
  pAVar11 = (local_38->best_k_combinations).
            super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
            super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (local_38->best_k_combinations).
           super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
           super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar11 == pAVar1) {
    AVar3.exponent = '\0';
    AVar3.factor = '\0';
  }
  else {
    uVar10 = 0xffffffffffffffff;
    lVar9 = 0;
    uVar7 = 0;
    AVar5.exponent = '\0';
    AVar5.factor = '\0';
    do {
      uVar4 = DryCompressToEstimateSize<false>(&local_58,SUB42(*(undefined4 *)pAVar11,0));
      if (uVar4 < uVar10) {
        AVar5 = pAVar11->encoding_indices;
        uVar7 = (ushort)AVar5 >> 8;
        lVar9 = 0;
        cVar2 = '\0';
        uVar10 = uVar4;
      }
      else {
        lVar9 = lVar9 + 1;
        cVar2 = (lVar9 != 2) + '\x05';
      }
    } while (((cVar2 == '\x06') || (cVar2 == '\0')) && (pAVar11 = pAVar11 + 1, pAVar11 != pAVar1));
    AVar3 = (AlpEncodingIndices)((ushort)AVar5 & 0xff | uVar7 << 8);
  }
  local_38->vector_encoding_indices = AVar3;
  if (local_58.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_58.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void FindBestFactorAndExponent(const T *input_vector, idx_t n_values, State &state) {
		//! We sample equidistant values within a vector; to do this we skip a fixed number of values
		vector<T> vector_sample;
		auto idx_increments = MaxValue<uint32_t>(
		    1, ExactNumericCast<uint32_t>(std::ceil((double)n_values / AlpConstants::SAMPLES_PER_VECTOR)));
		for (idx_t i = 0; i < n_values; i += idx_increments) {
			vector_sample.push_back(input_vector[i]);
		}

		AlpEncodingIndices best_encoding_indices = {0, 0};
		uint64_t best_total_bits = NumericLimits<uint64_t>::Maximum();
		idx_t worse_total_bits_counter = 0;

		//! We try each K combination in search for the one which minimize the compression size in the vector
		for (auto &combination : state.best_k_combinations) {
			uint64_t estimated_compression_size =
			    DryCompressToEstimateSize<false>(vector_sample, combination.encoding_indices);

			// If current compression size is worse (higher) or equal than the current best combination
			if (estimated_compression_size >= best_total_bits) {
				worse_total_bits_counter += 1;
				// Early exit strategy
				if (worse_total_bits_counter == AlpConstants::SAMPLING_EARLY_EXIT_THRESHOLD) {
					break;
				}
				continue;
			}
			// Otherwise we replace the best and continue trying with the next combination
			best_total_bits = estimated_compression_size;
			best_encoding_indices = combination.encoding_indices;
			worse_total_bits_counter = 0;
		}
		state.vector_encoding_indices = best_encoding_indices;
	}